

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::GrowStack(BitState *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ostream *poVar4;
  LogMessage local_1a0;
  Job *local_20;
  Job *newjob;
  BitState *this_local;
  
  this->maxjob_ = this->maxjob_ << 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->maxjob_;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  newjob = (Job *)this;
  local_20 = (Job *)operator_new__(uVar3);
  memmove(local_20,this->job_,(long)this->njob_ << 4);
  if (this->job_ != (Job *)0x0) {
    operator_delete__(this->job_);
  }
  this->job_ = local_20;
  bVar1 = this->njob_ < this->maxjob_;
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
               0x71);
    poVar4 = LogMessage::stream(&local_1a0);
    std::operator<<(poVar4,"Job stack overflow.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  return bVar1;
}

Assistant:

bool BitState::GrowStack() {
  // VLOG(0) << "Reallocate.";
  maxjob_ *= 2;
  Job* newjob = new Job[maxjob_];
  memmove(newjob, job_, njob_*sizeof job_[0]);
  delete[] job_;
  job_ = newjob;
  if (njob_ >= maxjob_) {
    LOG(DFATAL) << "Job stack overflow.";
    return false;
  }
  return true;
}